

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O3

sunrealtype ** SUNDlsMat_newBandMat(sunindextype n,sunindextype smu,sunindextype ml)

{
  sunrealtype **__ptr;
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    __ptr = (sunrealtype **)malloc(n * 8);
    if (__ptr != (sunrealtype **)0x0) {
      lVar3 = smu + ml + 1;
      psVar1 = (sunrealtype *)malloc(n * 8 * lVar3);
      *__ptr = psVar1;
      if (psVar1 != (sunrealtype *)0x0) {
        if (n == 1) {
          return __ptr;
        }
        psVar1 = psVar1 + ml + smu + 1;
        lVar2 = 1;
        do {
          __ptr[lVar2] = psVar1;
          lVar2 = lVar2 + 1;
          psVar1 = psVar1 + lVar3;
        } while (n != lVar2);
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (sunrealtype **)0x0;
}

Assistant:

sunrealtype** SUNDlsMat_newBandMat(sunindextype n, sunindextype smu,
                                   sunindextype ml)
{
  sunrealtype** a;
  sunindextype j, colSize;

  if (n <= 0) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  colSize = smu + ml + 1;
  a[0]    = NULL;
  a[0]    = (sunrealtype*)malloc(n * colSize * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * colSize; }

  return (a);
}